

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CategoricalMapping.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::CategoricalMapping::_InternalParse
          (CategoricalMapping *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  internal *this_01;
  size_t size;
  bool bVar4;
  uint uVar5;
  Int64ToStringMap *msg;
  string *s;
  char cVar6;
  uint res;
  uint32_t res32;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *field_name;
  Arena *pAVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  StringPiece str;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar4) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *local_38;
      res = (uint)bVar1;
      field_name = local_38 + 1;
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*field_name * 0x80) - 0x80;
        if ((char)*field_name < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_38,res);
          field_name = (byte *)pVar9.first;
          res = pVar9.second;
        }
        else {
          field_name = local_38 + 2;
        }
      }
      uVar5 = res >> 3;
      cVar6 = (char)res;
      local_38 = field_name;
      if (uVar5 < 0x65) {
        if (uVar5 == 1) {
          if (cVar6 == '\n') {
            if (this->_oneof_case_[0] != 1) {
              clear_MappingType(this);
              this->_oneof_case_[0] = 1;
              uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
              pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
              if ((uVar3 & 1) != 0) {
                pAVar8 = *(Arena **)pAVar8;
              }
              msg = (Int64ToStringMap *)
                    google::protobuf::Arena::
                    CreateMaybeMessage<CoreML::Specification::StringToInt64Map>(pAVar8);
              goto LAB_0031de23;
            }
LAB_0031dd21:
            msg = (Int64ToStringMap *)(this->MappingType_).stringtoint64map_;
            goto LAB_0031de2e;
          }
        }
        else if ((uVar5 == 2) && (cVar6 == '\x12')) {
          if (this->_oneof_case_[0] == 2) goto LAB_0031dd21;
          clear_MappingType(this);
          this->_oneof_case_[0] = 2;
          uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar8 = (Arena *)(uVar3 & 0xfffffffffffffffc);
          if ((uVar3 & 1) != 0) {
            pAVar8 = *(Arena **)pAVar8;
          }
          msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Int64ToStringMap>
                          (pAVar8);
LAB_0031de23:
          (this->MappingType_).int64tostringmap_ = msg;
LAB_0031de2e:
          local_38 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,&msg->super_MessageLite,(char *)local_38);
          goto joined_r0x0031de6f;
        }
LAB_0031ddc0:
        if ((res == 0) || ((res & 7) == 4)) {
          if (field_name == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)field_name;
        }
        if ((this_00->ptr_ & 1U) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
        }
        local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_38,ctx);
      }
      else if (uVar5 == 0x65) {
        if (cVar6 != '*') goto LAB_0031ddc0;
        if (this->_oneof_case_[1] != 0x65) {
          clear_ValueOnUnknown(this);
          this->_oneof_case_[1] = 0x65;
          (this->ValueOnUnknown_).int64value_ =
               (int64_t)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        }
        puVar7 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
        if ((this_00->ptr_ & 1U) != 0) {
          puVar7 = (undefined8 *)*puVar7;
        }
        s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                      ((ArenaStringPtr *)&this->ValueOnUnknown_,puVar7);
        local_38 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (s,(char *)local_38,ctx);
        this_01 = (internal *)(s->_M_dataplus)._M_p;
        size = s->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        str.length_ = 0;
        str.ptr_ = (char *)size;
        bVar4 = google::protobuf::internal::VerifyUTF8(this_01,str,(char *)field_name);
        if (!bVar4) {
          return (char *)0x0;
        }
      }
      else {
        if ((uVar5 != 0x66) || (cVar6 != '0')) goto LAB_0031ddc0;
        bVar1 = *field_name;
        pVar10.second = (long)(char)bVar1;
        pVar10.first = (char *)(field_name + 1);
        if ((long)(char)bVar1 < 0) {
          bVar2 = field_name[1];
          res32 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
          if ((char)bVar2 < '\0') {
            pVar10 = google::protobuf::internal::VarintParseSlow64((char *)field_name,res32);
          }
          else {
            pVar10.second._0_4_ = res32;
            pVar10.first = (char *)(field_name + 2);
            pVar10.second._4_4_ = 0;
          }
        }
        local_38 = (byte *)pVar10.first;
        if (this->_oneof_case_[1] != 0x66) {
          clear_ValueOnUnknown(this);
          this->_oneof_case_[1] = 0x66;
        }
        (this->ValueOnUnknown_).int64value_ = pVar10.second;
      }
joined_r0x0031de6f:
      if (local_38 == (byte *)0x0) {
        return (char *)0x0;
      }
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_38;
}

Assistant:

const char* CategoricalMapping::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.StringToInt64Map stringToInt64Map = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_stringtoint64map(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Int64ToStringMap int64ToStringMap = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_int64tostringmap(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string strValue = 101;
      case 101:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 42)) {
          auto str = _internal_mutable_strvalue();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // int64 int64Value = 102;
      case 102:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 48)) {
          _internal_set_int64value(::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}